

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void recall_execute(CHAR_DATA *ch,ROOM_INDEX_DATA *location)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  ROOM_INDEX_DATA *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  CHAR_DATA *in_stack_00000040;
  char *in_stack_00005c40;
  CHAR_DATA *in_stack_00005c48;
  CHAR_DATA *ch_00;
  
  if ((in_RDI->fighting == (CHAR_DATA *)0x0) && ((in_RDI->disrupted & 1U) == 0)) {
    in_RDI->move = in_RDI->move / 2;
    ch_00 = in_RDI;
    iVar2 = number_percent();
    if ((iVar2 < 0x29) || (bVar1 = is_affected_by(ch_00,(int)((ulong)in_RSI >> 0x20)), !bVar1)) {
      bVar1 = is_affected(ch_00,(int)gsn_camouflage);
      if (bVar1) {
        affect_strip(unaff_retaddr,(int)((ulong)ch_00 >> 0x20));
        act((char *)unaff_retaddr,ch_00,in_RSI,in_RDI,0);
        send_to_char((char *)unaff_retaddr,ch_00);
      }
      un_watermeld(in_RSI,(char *)in_RDI);
      act((char *)unaff_retaddr,ch_00,in_RSI,in_RDI,0);
      act((char *)unaff_retaddr,ch_00,in_RSI,in_RDI,0);
      char_from_room(in_stack_00000040);
      char_to_room(in_stack_00000020,in_stack_00000018);
      act((char *)unaff_retaddr,ch_00,in_RSI,in_RDI,0);
      iVar2 = (int)((ulong)ch_00 >> 0x20);
      do_look(in_stack_00005c48,in_stack_00005c40);
      check_plasma_thread(unaff_retaddr,iVar2);
    }
    else {
      send_to_char((char *)unaff_retaddr,ch_00);
    }
  }
  else {
    send_to_char((char *)unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void recall_execute(CHAR_DATA *ch, ROOM_INDEX_DATA *location)
{
	if (ch->fighting || ch->disrupted)
	{
		send_to_char("The magic of the recall spell dissipates as your focus is disrupted.\n\r", ch);
		return;
	}

	ch->move /= 2;

	if (number_percent() > 40 && is_affected_by(ch, AFF_CURSE))
	{
		send_to_char("The power of the curse laid upon you dissipates the magic of the spell.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_camouflage))
	{
		affect_strip(ch, gsn_camouflage);
		act("$n steps out from $s cover.", ch, 0, 0, TO_ROOM);
		send_to_char("You step out from your cover.\n\r", ch);
	}

	un_watermeld(ch, nullptr);

	act("As the magic takes effect, a black haze clouds your mind.\n\rWhen it passes, you find yourself elsewhere.", ch, 0, 0, TO_CHAR);
	act("$n suddenly disappears.", ch, nullptr, nullptr, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, location);

	act("$n suddenly appears in the room.", ch, nullptr, nullptr, TO_ROOM);

	do_look(ch, "auto");
	check_plasma_thread(ch, -1);
}